

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall pbrt::Disk::Sample(Disk *this,Point2f u)

{
  Normal3f n_00;
  Normal3<float> n_01;
  Tuple2<pbrt::Point2,_float> in_RSI;
  Tuple2<pbrt::Point2,_float> in_RDI;
  float fVar1;
  float fVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [64];
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  Normal3<float> NVar7;
  Point2f uv;
  Float radiusSample;
  Float phi;
  Normal3f n;
  Point3fi pi;
  Point3f pObj;
  Point2f pd;
  Point3fi *in_stack_00000348;
  Transform *in_stack_00000350;
  float in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  Tuple2<pbrt::Point2,_float> uv_00;
  Point3f *p;
  undefined1 *puVar8;
  float fVar9;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  float in_stack_fffffffffffffeb0;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff74;
  undefined8 local_70;
  float local_68;
  undefined1 local_64 [48];
  Point3f local_34;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_10;
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  
  local_28 = vmovlpd_avx(in_ZMM0._0_16_);
  uv_00 = in_RDI;
  local_10 = local_28;
  auVar3._0_8_ = SampleUniformDiskConcentric(in_RSI);
  auVar3._8_56_ = extraout_var;
  local_20 = vmovlpd_avx(auVar3._0_16_);
  p = &local_34;
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,0.0);
  puVar8 = local_64;
  Point3fi::Point3fi(*(Point3fi **)in_RSI,p);
  Transform::operator()(in_stack_00000350,in_stack_00000348);
  fVar9 = (float)*(undefined8 *)in_RSI;
  Normal3<float>::Normal3
            ((Normal3<float> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,0.0);
  auVar6 = ZEXT856(0);
  n_01.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)in_stack_ffffffffffffff74;
  n_01.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)((ulong)in_stack_ffffffffffffff74 >> 0x20)
  ;
  n_01.super_Tuple3<pbrt::Normal3,_float>.x = in_stack_ffffffffffffff70;
  NVar7 = Transform::operator()
                    ((Transform *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),n_01
                    );
  auVar4._0_8_ = NVar7.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  vmovlpd_avx(auVar4._0_16_);
  auVar6 = ZEXT856(0);
  NVar7.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffeac;
  NVar7.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffea8;
  NVar7.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffeb0;
  NVar7 = Normalize<float>(NVar7);
  local_68 = NVar7.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar5._0_8_ = NVar7.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  local_70 = vmovlpd_avx(auVar5._0_16_);
  if ((*(byte *)((long)in_RSI + 0x10) & 1) != 0) {
    Tuple3<pbrt::Normal3,float>::operator*=((Tuple3<pbrt::Normal3,float> *)&local_70,-1);
  }
  std::atan2((double)(local_20 >> 0x20),(double)(local_20 & 0xffffffff));
  fVar1 = Sqr<float>(local_34.super_Tuple3<pbrt::Point3,_float>.x);
  fVar2 = Sqr<float>(local_34.super_Tuple3<pbrt::Point3,_float>.y);
  std::sqrt((double)(ulong)(uint)(fVar1 + fVar2));
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(fVar1,in_stack_fffffffffffffe60),in_stack_fffffffffffffe5c,
             in_stack_fffffffffffffe58);
  n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar9;
  n_00.super_Tuple3<pbrt::Normal3,_float>._0_8_ = puVar8;
  Interaction::Interaction
            ((Interaction *)in_RDI,(Point3fi *)CONCAT44(fVar1,in_stack_fffffffffffffe60),n_00,
             (Point2f)uv_00);
  Area((Disk *)CONCAT44(fVar1,in_stack_fffffffffffffe60));
  pstd::optional<pbrt::ShapeSample>::optional
            ((optional<pbrt::ShapeSample> *)CONCAT44(fVar1,in_stack_fffffffffffffe60),
             (ShapeSample *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  return (optional<pbrt::ShapeSample> *)uv_00;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(Point2f u) const {
        Point2f pd = SampleUniformDiskConcentric(u);
        Point3f pObj(pd.x * radius, pd.y * radius, height);
        Point3fi pi = (*renderFromObject)(Point3fi(pObj));
        Normal3f n = Normalize((*renderFromObject)(Normal3f(0, 0, 1)));

        if (reverseOrientation)
            n *= -1;
        // Compute $(u,v)$ for sampled point on disk
        Float phi = std::atan2(pd.y, pd.x);
        if (phi < 0)
            phi += 2 * Pi;
        Float radiusSample = std::sqrt(Sqr(pObj.x) + Sqr(pObj.y));
        Point2f uv(phi / phiMax, (radius - radiusSample) / (radius - innerRadius));

        return ShapeSample{Interaction(pi, n, uv), 1 / Area()};
    }